

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

void __thiscall
ON_Evaluator::ON_Evaluator
          (ON_Evaluator *this,int parameter_count,int value_count,ON_Interval *domain,bool *periodic
          )

{
  int local_54;
  bool local_3d [17];
  int local_2c;
  bool *pbStack_28;
  int i;
  bool *periodic_local;
  ON_Interval *domain_local;
  int value_count_local;
  int parameter_count_local;
  ON_Evaluator *this_local;
  
  this->_vptr_ON_Evaluator = (_func_int **)&PTR__ON_Evaluator_00b72b50;
  this->m_parameter_count = parameter_count;
  local_54 = parameter_count;
  if (0 < value_count) {
    local_54 = value_count;
  }
  this->m_value_count = local_54;
  pbStack_28 = periodic;
  periodic_local = (bool *)domain;
  domain_local._0_4_ = value_count;
  domain_local._4_4_ = parameter_count;
  _value_count_local = this;
  ON_SimpleArray<ON_Interval>::ON_SimpleArray(&this->m_domain);
  ON_SimpleArray<bool>::ON_SimpleArray(&this->m_bPeriodicParameter);
  if (periodic_local != (bool *)0x0) {
    ON_SimpleArray<ON_Interval>::Reserve(&this->m_domain,(long)this->m_parameter_count);
    for (local_2c = 0; local_2c < domain_local._4_4_; local_2c = local_2c + 1) {
      ON_SimpleArray<ON_Interval>::Append
                (&this->m_domain,(ON_Interval *)(periodic_local + (long)local_2c * 0x10));
    }
    if (pbStack_28 != (bool *)0x0) {
      for (local_2c = 0; local_2c < domain_local._4_4_; local_2c = local_2c + 1) {
        if ((pbStack_28[local_2c] & 1U) != 0) {
          ON_SimpleArray<bool>::Reserve(&this->m_bPeriodicParameter,(long)this->m_parameter_count);
          for (local_2c = 0; local_2c < this->m_parameter_count; local_2c = local_2c + 1) {
            local_3d[0] = (bool)(pbStack_28[local_2c] & 1);
            ON_SimpleArray<bool>::Append(&this->m_bPeriodicParameter,local_3d);
          }
          return;
        }
      }
    }
  }
  return;
}

Assistant:

ON_Evaluator::ON_Evaluator( 
                           int parameter_count,
                           int value_count,
                           const ON_Interval* domain,
                           const bool* periodic
                           )
             : m_parameter_count(parameter_count),
               m_value_count(value_count>0?value_count:parameter_count)
{
  int i;

  if (domain)
  {
    m_domain.Reserve(m_parameter_count);
    for ( i = 0; i < parameter_count; i++ )
      m_domain.Append(domain[i]);

    if (periodic )
    {
      for ( i = 0; i < parameter_count; i++ )
      {
        if  (periodic[i])
        {
          m_bPeriodicParameter.Reserve(m_parameter_count);
          for ( i = 0; i < m_parameter_count; i++ )
          {
            m_bPeriodicParameter.Append(periodic[i]?true:false);
          }
          break;
        }
      }
    }
  }
}